

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::php::(anonymous_namespace)::ConstantNamePrefix_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,string_view classname)

{
  bool bVar1;
  bool bVar2;
  long lVar3;
  string_view name;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  allocator<char> local_41;
  string lower;
  
  absl::lts_20250127::AsciiStrToLower_abi_cxx11_(&lower,(lts_20250127 *)this,classname);
  name._M_str = lower._M_dataplus._M_p;
  name._M_len = lower._M_string_length;
  bVar1 = IsReservedName(name);
  lVar3 = 8;
  do {
    if (lVar3 + 0x10 == 0xd8) {
      if (bVar1) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"PB",&local_41);
        goto LAB_00b550b6;
      }
      break;
    }
    __x._M_str = lower._M_dataplus._M_p;
    __x._M_len = lower._M_string_length;
    bVar2 = std::operator==(__x,*(basic_string_view<char,_std::char_traits<char>_> *)
                                 ((long)&kDescriptorMetadataFile._M_str + lVar3));
    lVar3 = lVar3 + 0x10;
  } while (!bVar2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,anon_var_dwarf_651463 + 5,&local_41);
LAB_00b550b6:
  std::__cxx11::string::~string((string *)&lower);
  return __return_storage_ptr__;
}

Assistant:

std::string ConstantNamePrefix(absl::string_view classname) {
  bool is_reserved = false;

  std::string lower = absl::AsciiStrToLower(classname);

  is_reserved = IsReservedName(lower);

  for (int i = 0; i < kValidConstantNamesSize; i++) {
    if (lower == kValidConstantNames[i]) {
      is_reserved = false;
      break;
    }
  }

  if (is_reserved) {
    return "PB";
  }

  return "";
}